

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O3

void Curl_bufq_reset(bufq *q)

{
  buf_chunk *pbVar1;
  buf_chunk *pbVar2;
  buf_chunk *pbVar3;
  
  if (q->head != (buf_chunk *)0x0) {
    pbVar1 = q->head;
    pbVar3 = q->spare;
    do {
      pbVar2 = pbVar1;
      pbVar1 = pbVar2->next;
      pbVar2->next = pbVar3;
      pbVar3 = pbVar2;
    } while (pbVar1 != (buf_chunk *)0x0);
    q->head = (buf_chunk *)0x0;
    q->spare = pbVar2;
  }
  q->tail = (buf_chunk *)0x0;
  return;
}

Assistant:

void Curl_bufq_reset(struct bufq *q)
{
  struct buf_chunk *chunk;
  while(q->head) {
    chunk = q->head;
    q->head = chunk->next;
    chunk->next = q->spare;
    q->spare = chunk;
  }
  q->tail = NULL;
}